

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

symbol * get_base_symbol_type(dmr_C *C,access_data *ad)

{
  char cVar1;
  tokenizer_state_t *ptVar2;
  char *pcVar3;
  symbol *psVar4;
  
  ptVar2 = C->T;
  if (ptVar2->input_stream_nr == 1) {
    if (**(char **)(ptVar2->special + 0xc) != ')') {
      return (symbol *)0x0;
    }
    pcVar3 = *(char **)(ptVar2->special + 0xc) + 0x30;
  }
  else {
    if (ptVar2->input_stream_nr != 2) {
      return (symbol *)0x0;
    }
    pcVar3 = ptVar2->special + 0xc;
  }
  psVar4 = *(symbol **)pcVar3;
  if (psVar4 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
  cVar1 = *(char *)psVar4;
  if (cVar1 == '\x03') {
    psVar4 = (psVar4->field_14).field_2.ctype.base_type;
    cVar1 = *(char *)psVar4;
  }
  if (cVar1 == '\x04') {
    return (psVar4->field_14).field_2.ctype.base_type;
  }
  return psVar4;
}

Assistant:

static struct symbol *get_base_symbol_type(struct dmr_C *C, struct access_data *ad) {
        (void) C;
	struct symbol *orig_type = NULL;
	if (ad->address->type == PSEUDO_SYM) {
		orig_type = ad->address->sym;
	}
	else if (ad->address->type == PSEUDO_REG) {
		if (ad->address->def->opcode == OP_LOAD) {
			orig_type = ad->address->def->orig_type;
		}
	}
	if (orig_type) {
		if (orig_type->type == SYM_NODE)
			orig_type = orig_type->ctype.base_type;
		if (orig_type->type == SYM_PTR)
			orig_type = orig_type->ctype.base_type;
		//dmrC_show_type(C, orig_type);
	}
	return orig_type;
}